

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Insert
          (ScriptContextOptimizationOverrideInfo *this,ScriptContextOptimizationOverrideInfo *info)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContextOptimizationOverrideInfo *info_local;
  ScriptContextOptimizationOverrideInfo *this_local;
  
  CopyTo(this,info);
  if (this != this->crossSiteRoot) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                ,0x91,"(this == this->crossSiteRoot)","this == this->crossSiteRoot")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  info->crossSiteRoot = this;
  info->crossSiteNext = this;
  info->crossSitePrev = this->crossSitePrev;
  this->crossSitePrev->crossSiteNext = info;
  this->crossSitePrev = info;
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Insert(ScriptContextOptimizationOverrideInfo * info)
{
    // Copy the information
    this->CopyTo(info);

    // Insert
    // Only insert at the root
    Assert(this == this->crossSiteRoot);
    info->crossSiteRoot = this;
    info->crossSiteNext = this;
    info->crossSitePrev = this->crossSitePrev;
    this->crossSitePrev->crossSiteNext = info;
    this->crossSitePrev = info;
}